

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::GetRPath
          (cmComputeLinkInformation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *runtimeDirs,bool for_install)

{
  cmMakefile *pcVar1;
  cmTarget *pcVar2;
  bool bVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  reference pbVar7;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  byte local_552;
  bool local_475;
  byte local_474;
  byte local_473;
  bool local_45b;
  byte local_45a;
  char *dirs;
  undefined1 local_418 [8];
  string dirVar;
  undefined1 local_3d8 [8];
  string useVar;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3b0;
  const_iterator li;
  LinkClosure *lc;
  string local_380 [8];
  string suffix_1;
  undefined1 local_340 [8];
  string d_1;
  string local_318;
  byte local_2f3;
  byte local_2f2;
  allocator local_2f1;
  string local_2f0;
  byte local_2cb;
  byte local_2ca;
  allocator local_2c9;
  string local_2c8;
  allocator local_2a1;
  string local_2a0;
  char *local_280;
  char *topBinaryDir;
  char *topSourceDir;
  undefined1 local_268;
  _Base_ptr local_260;
  undefined1 local_258;
  string local_250 [8];
  string suffix;
  undefined1 local_210 [8];
  string d;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e8;
  const_iterator ri;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rdirs;
  string local_1d0;
  char *local_1b0;
  char *installPrefix;
  string local_1a0;
  char *local_180;
  char *stagePath;
  string local_170;
  undefined1 local_150 [8];
  string rootPath;
  string local_128;
  char *local_108;
  char *install_rpath;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string local_c8;
  byte local_a3;
  byte local_a2;
  allocator local_a1;
  string local_a0;
  byte local_7e;
  byte local_7d;
  byte local_7c;
  byte local_7b;
  byte local_7a;
  allocator local_79;
  undefined1 local_78 [2];
  bool use_link_rpath;
  bool use_build_rpath;
  bool use_install_rpath;
  byte local_55;
  bool linking_for_install;
  allocator local_41;
  string local_40;
  byte local_1a;
  byte local_19;
  bool outputRuntime;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  bool for_install_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *runtimeDirs_local;
  cmComputeLinkInformation *this_local;
  
  pcVar1 = this->Makefile;
  local_19 = for_install;
  pvStack_18 = runtimeDirs;
  runtimeDirs_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"CMAKE_SKIP_RPATH",&local_41);
  bVar3 = cmMakefile::IsOn(pcVar1,&local_40);
  local_45a = 0;
  if (!bVar3) {
    local_45a = std::__cxx11::string::empty();
    local_45a = local_45a ^ 0xff;
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_1a = local_45a & 1;
  local_7a = 0;
  local_7b = 0;
  local_45b = true;
  if ((local_19 & 1) == 0) {
    pcVar2 = this->Target;
    std::allocator<char>::allocator();
    local_7a = 1;
    std::__cxx11::string::string((string *)local_78,"BUILD_WITH_INSTALL_RPATH",&local_79);
    local_7b = 1;
    local_45b = cmTarget::GetPropertyAsBool(pcVar2,(string *)local_78);
  }
  if ((local_7b & 1) != 0) {
    std::__cxx11::string::~string((string *)local_78);
  }
  if ((local_7a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  local_55 = local_45b;
  local_473 = 0;
  if ((local_1a & 1) != 0) {
    bVar3 = cmTarget::HaveInstallTreeRPATH(this->Target);
    local_473 = 0;
    if (bVar3) {
      local_473 = local_55;
    }
  }
  local_7c = local_473 & 1;
  local_474 = 0;
  if ((local_1a & 1) != 0) {
    bVar3 = cmTarget::HaveBuildTreeRPATH(this->Target,&this->Config);
    local_474 = 0;
    if (bVar3) {
      local_474 = local_55 ^ 0xff;
    }
  }
  local_7d = local_474 & 1;
  local_a2 = 0;
  local_a3 = 0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 0;
  local_475 = false;
  if (((local_1a & 1) != 0) && (local_475 = false, (local_55 & 1) != 0)) {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    local_a2 = 1;
    std::__cxx11::string::string((string *)&local_a0,"CMAKE_SKIP_INSTALL_RPATH",&local_a1);
    local_a3 = 1;
    bVar3 = cmMakefile::IsOn(pcVar1,&local_a0);
    local_475 = false;
    if (!bVar3) {
      pcVar2 = this->Target;
      std::allocator<char>::allocator();
      emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
      std::__cxx11::string::string
                ((string *)&local_c8,"INSTALL_RPATH_USE_LINK_PATH",
                 (allocator *)((long)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count + 7))
      ;
      emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 1;
      local_475 = cmTarget::GetPropertyAsBool(pcVar2,&local_c8);
    }
  }
  if ((emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c8);
  }
  if ((emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  }
  if ((local_a3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if ((local_a2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  local_7e = local_475;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&install_rpath);
  if ((local_7c & 1) != 0) {
    pcVar2 = this->Target;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_128,"INSTALL_RPATH",
               (allocator *)(rootPath.field_2._M_local_buf + 0xf));
    pcVar4 = cmTarget::GetProperty(pcVar2,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)(rootPath.field_2._M_local_buf + 0xf));
    local_108 = pcVar4;
    cmCLI_ExpandListUnique
              (pcVar4,pvStack_18,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&install_rpath);
  }
  if (((local_7d & 1) != 0) || ((local_7e & 1) != 0)) {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_170,"CMAKE_SYSROOT",(allocator *)((long)&stagePath + 7));
    pcVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_170);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_150,pcVar4,(allocator *)((long)&stagePath + 6));
    std::allocator<char>::~allocator((allocator<char> *)((long)&stagePath + 6));
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator((allocator<char> *)((long)&stagePath + 7));
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1a0,"CMAKE_STAGING_PREFIX",(allocator *)((long)&installPrefix + 7));
    pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&installPrefix + 7));
    pcVar1 = this->Makefile;
    local_180 = pcVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1d0,"CMAKE_INSTALL_PREFIX",(allocator *)((long)&rdirs + 7));
    pcVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&rdirs + 7));
    local_1b0 = pcVar4;
    cmsys::SystemTools::ConvertToUnixSlashes((string *)local_150);
    ri._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         GetRuntimeSearchPath_abi_cxx11_(this);
    local_1e8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)ri._M_current);
    while( true ) {
      d.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)ri._M_current);
      bVar3 = __gnu_cxx::operator!=
                        (&local_1e8,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&d.field_2 + 8));
      if (!bVar3) break;
      if ((local_7d & 1) == 0) {
        if ((local_7e & 1) != 0) {
          topBinaryDir = cmMakefile::GetHomeDirectory(this->Makefile);
          local_280 = cmMakefile::GetHomeOutputDirectory(this->Makefile);
          pbVar7 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_1e8);
          pcVar4 = topBinaryDir;
          std::allocator<char>::allocator();
          local_2ca = 0;
          local_2cb = 0;
          local_2f2 = 0;
          local_2f3 = 0;
          d_1.field_2._M_local_buf[0xe] = '\0';
          d_1.field_2._M_local_buf[0xd] = '\0';
          std::__cxx11::string::string((string *)&local_2a0,pcVar4,&local_2a1);
          bVar3 = cmsys::SystemTools::ComparePath(pbVar7,&local_2a0);
          local_552 = 0;
          if (!bVar3) {
            pbVar7 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_1e8);
            pcVar4 = local_280;
            std::allocator<char>::allocator();
            local_2ca = 1;
            std::__cxx11::string::string((string *)&local_2c8,pcVar4,&local_2c9);
            local_2cb = 1;
            bVar3 = cmsys::SystemTools::ComparePath(pbVar7,&local_2c8);
            local_552 = 0;
            if (!bVar3) {
              pbVar7 = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_1e8);
              pcVar4 = topBinaryDir;
              std::allocator<char>::allocator();
              local_2f2 = 1;
              std::__cxx11::string::string((string *)&local_2f0,pcVar4,&local_2f1);
              local_2f3 = 1;
              bVar3 = cmsys::SystemTools::IsSubDirectory(pbVar7,&local_2f0);
              local_552 = 0;
              if (!bVar3) {
                pbVar7 = __gnu_cxx::
                         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&local_1e8);
                pcVar4 = local_280;
                std::allocator<char>::allocator();
                d_1.field_2._M_local_buf[0xe] = '\x01';
                std::__cxx11::string::string
                          ((string *)&local_318,pcVar4,(allocator *)(d_1.field_2._M_local_buf + 0xf)
                          );
                d_1.field_2._M_local_buf[0xd] = '\x01';
                bVar3 = cmsys::SystemTools::IsSubDirectory(pbVar7,&local_318);
                local_552 = bVar3 ^ 0xff;
              }
            }
          }
          if ((d_1.field_2._M_local_buf[0xd] & 1U) != 0) {
            std::__cxx11::string::~string((string *)&local_318);
          }
          if ((d_1.field_2._M_local_buf[0xe] & 1U) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)(d_1.field_2._M_local_buf + 0xf));
          }
          if ((local_2f3 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_2f0);
          }
          if ((local_2f2 & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
          }
          if ((local_2cb & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_2c8);
          }
          if ((local_2ca & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
          }
          std::__cxx11::string::~string((string *)&local_2a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
          if ((local_552 & 1) != 0) {
            pbVar7 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_1e8);
            std::__cxx11::string::string((string *)local_340,(string *)pbVar7);
            uVar5 = std::__cxx11::string::empty();
            if (((uVar5 & 1) == 0) &&
               (lVar6 = std::__cxx11::string::find((string *)local_340,(ulong)local_150), lVar6 == 0
               )) {
              std::__cxx11::string::size();
              std::__cxx11::string::substr((ulong)((long)&suffix_1.field_2 + 8),(ulong)local_340);
              std::__cxx11::string::operator=
                        ((string *)local_340,(string *)(suffix_1.field_2._M_local_buf + 8));
              std::__cxx11::string::~string((string *)(suffix_1.field_2._M_local_buf + 8));
            }
            else if ((local_180 != (char *)0x0) &&
                    ((*local_180 != '\0' &&
                     (lVar6 = std::__cxx11::string::find(local_340,(ulong)local_180), lVar6 == 0))))
            {
              strlen(local_180);
              std::__cxx11::string::substr((ulong)local_380,(ulong)local_340);
              std::__cxx11::string::operator=((string *)local_340,local_1b0);
              std::__cxx11::string::operator+=((string *)local_340,"/");
              std::__cxx11::string::operator+=((string *)local_340,local_380);
              cmsys::SystemTools::ConvertToUnixSlashes((string *)local_340);
              std::__cxx11::string::~string(local_380);
            }
            pVar8 = std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&install_rpath,(value_type *)local_340);
            if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(pvStack_18,(value_type *)local_340);
            }
            std::__cxx11::string::~string((string *)local_340);
          }
        }
      }
      else {
        pbVar7 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_1e8);
        std::__cxx11::string::string((string *)local_210,(string *)pbVar7);
        uVar5 = std::__cxx11::string::empty();
        if (((uVar5 & 1) == 0) &&
           (lVar6 = std::__cxx11::string::find((string *)local_210,(ulong)local_150), lVar6 == 0)) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)((long)&suffix.field_2 + 8),(ulong)local_210);
          std::__cxx11::string::operator=
                    ((string *)local_210,(string *)(suffix.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(suffix.field_2._M_local_buf + 8));
        }
        else if ((local_180 != (char *)0x0) &&
                ((*local_180 != '\0' &&
                 (lVar6 = std::__cxx11::string::find(local_210,(ulong)local_180), lVar6 == 0)))) {
          strlen(local_180);
          std::__cxx11::string::substr((ulong)local_250,(ulong)local_210);
          std::__cxx11::string::operator=((string *)local_210,local_1b0);
          std::__cxx11::string::operator+=((string *)local_210,"/");
          std::__cxx11::string::operator+=((string *)local_210,local_250);
          cmsys::SystemTools::ConvertToUnixSlashes((string *)local_210);
          std::__cxx11::string::~string(local_250);
        }
        pVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&install_rpath,(value_type *)local_210);
        topSourceDir = (char *)pVar8.first._M_node;
        local_268 = pVar8.second;
        local_260 = (_Base_ptr)topSourceDir;
        local_258 = local_268;
        if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(pvStack_18,(value_type *)local_210);
        }
        std::__cxx11::string::~string((string *)local_210);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_1e8);
    }
    std::__cxx11::string::~string((string *)local_150);
  }
  li._M_current = &cmTarget::GetLinkClosure(this->Target,&this->Config)->LinkerLanguage;
  local_3b0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&((LinkClosure *)li._M_current)->Languages);
  while( true ) {
    useVar.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(li._M_current + 1));
    bVar3 = __gnu_cxx::operator!=
                      (&local_3b0,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&useVar.field_2 + 8));
    if (!bVar3) break;
    pbVar7 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_3b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&dirVar.field_2 + 8),"CMAKE_",pbVar7);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&dirVar.field_2 + 8),"_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH");
    std::__cxx11::string::~string((string *)(dirVar.field_2._M_local_buf + 8));
    bVar3 = cmMakefile::IsOn(this->Makefile,(string *)local_3d8);
    if (bVar3) {
      pbVar7 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_3b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dirs,
                     "CMAKE_",pbVar7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dirs,
                     "_IMPLICIT_LINK_DIRECTORIES");
      std::__cxx11::string::~string((string *)&dirs);
      pcVar4 = cmMakefile::GetDefinition(this->Makefile,(string *)local_418);
      if (pcVar4 != (char *)0x0) {
        cmCLI_ExpandListUnique
                  (pcVar4,pvStack_18,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&install_rpath);
      }
      std::__cxx11::string::~string((string *)local_418);
    }
    std::__cxx11::string::~string((string *)local_3d8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_3b0);
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCLI_ExpandListUnique
            (pcVar4,pvStack_18,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&install_rpath);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&install_rpath);
  return;
}

Assistant:

void cmComputeLinkInformation::GetRPath(std::vector<std::string>& runtimeDirs,
                                        bool for_install)
{
  // Select whether to generate runtime search directories.
  bool outputRuntime =
    !this->Makefile->IsOn("CMAKE_SKIP_RPATH") && !this->RuntimeFlag.empty();

  // Select whether to generate an rpath for the install tree or the
  // build tree.
  bool linking_for_install =
    (for_install ||
     this->Target->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"));
  bool use_install_rpath =
    (outputRuntime && this->Target->HaveInstallTreeRPATH() &&
     linking_for_install);
  bool use_build_rpath =
    (outputRuntime && this->Target->HaveBuildTreeRPATH(this->Config) &&
     !linking_for_install);
  bool use_link_rpath =
    outputRuntime && linking_for_install &&
    !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH") &&
    this->Target->GetPropertyAsBool("INSTALL_RPATH_USE_LINK_PATH");

  // Construct the RPATH.
  std::set<std::string> emitted;
  if(use_install_rpath)
    {
    const char* install_rpath = this->Target->GetProperty("INSTALL_RPATH");
    cmCLI_ExpandListUnique(install_rpath, runtimeDirs, emitted);
    }
  if(use_build_rpath || use_link_rpath)
    {
    std::string rootPath = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
    const char *stagePath
                  = this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX");
    const char *installPrefix
                  = this->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
    cmSystemTools::ConvertToUnixSlashes(rootPath);
    std::vector<std::string> const& rdirs = this->GetRuntimeSearchPath();
    for(std::vector<std::string>::const_iterator ri = rdirs.begin();
        ri != rdirs.end(); ++ri)
      {
      // Put this directory in the rpath if using build-tree rpath
      // support or if using the link path as an rpath.
      if(use_build_rpath)
        {
        std::string d = *ri;
        if (!rootPath.empty() && d.find(rootPath) == 0)
          {
          d = d.substr(rootPath.size());
          }
        else if (stagePath && *stagePath && d.find(stagePath) == 0)
          {
          std::string suffix = d.substr(strlen(stagePath));
          d = installPrefix;
          d += "/";
          d += suffix;
          cmSystemTools::ConvertToUnixSlashes(d);
          }
        if(emitted.insert(d).second)
          {
          runtimeDirs.push_back(d);
          }
        }
      else if(use_link_rpath)
        {
        // Do not add any path inside the source or build tree.
        const char* topSourceDir = this->Makefile->GetHomeDirectory();
        const char* topBinaryDir = this->Makefile->GetHomeOutputDirectory();
        if(!cmSystemTools::ComparePath(*ri, topSourceDir) &&
           !cmSystemTools::ComparePath(*ri, topBinaryDir) &&
           !cmSystemTools::IsSubDirectory(*ri, topSourceDir) &&
           !cmSystemTools::IsSubDirectory(*ri, topBinaryDir))
          {
          std::string d = *ri;
          if (!rootPath.empty() && d.find(rootPath) == 0)
            {
            d = d.substr(rootPath.size());
            }
          else if (stagePath && *stagePath && d.find(stagePath) == 0)
            {
            std::string suffix = d.substr(strlen(stagePath));
            d = installPrefix;
            d += "/";
            d += suffix;
            cmSystemTools::ConvertToUnixSlashes(d);
            }
          if(emitted.insert(d).second)
            {
            runtimeDirs.push_back(d);
            }
          }
        }
      }
    }

  // Add runtime paths required by the languages to always be
  // present.  This is done even when skipping rpath support.
  {
  cmTarget::LinkClosure const* lc =
    this->Target->GetLinkClosure(this->Config);
  for(std::vector<std::string>::const_iterator li = lc->Languages.begin();
      li != lc->Languages.end(); ++li)
    {
    std::string useVar = "CMAKE_" + *li +
      "_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH";
    if(this->Makefile->IsOn(useVar))
      {
      std::string dirVar = "CMAKE_" + *li +
        "_IMPLICIT_LINK_DIRECTORIES";
      if(const char* dirs = this->Makefile->GetDefinition(dirVar))
        {
        cmCLI_ExpandListUnique(dirs, runtimeDirs, emitted);
        }
      }
    }
  }

  // Add runtime paths required by the platform to always be
  // present.  This is done even when skipping rpath support.
  cmCLI_ExpandListUnique(this->RuntimeAlways.c_str(), runtimeDirs, emitted);
}